

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  ostream *poVar9;
  long *plVar10;
  undefined **ppuVar11;
  uint uVar12;
  char **ppcVar13;
  ifstream *this;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  bool bVar17;
  allocator local_435;
  int input_block_length;
  ulong local_430;
  int output_block_length;
  int input_end_number;
  int input_start_number;
  int output_start_number;
  double local_418;
  undefined8 uStack_410;
  string local_408;
  string data_type;
  double pad_value;
  double local_3c0;
  double local_3b8;
  ostringstream error_message_14;
  ifstream ifs;
  byte abStack_218 [488];
  
  input_start_number = 0;
  input_end_number = 0x1ff;
  output_start_number = 0;
  input_block_length = 0x200;
  output_block_length = 0x200;
  pad_value = 0.0;
  std::__cxx11::string::string((string *)&data_type,"d",(allocator *)&ifs);
  local_430 = 0;
  local_418 = 0.0;
LAB_0010368e:
  do {
    iVar6 = ya_getopt_long(argc,argv,"s:e:l:m:S:L:M:f:h",(option *)0x0,(int *)0x0);
    switch(iVar6) {
    case 0x65:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&input_end_number);
      bVar17 = input_end_number < 0;
      uVar8 = std::__cxx11::string::~string((string *)&ifs);
      local_418 = (double)CONCAT71((int7)((ulong)uVar8 >> 8),1);
      if (!bVar4 || bVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar9 = std::operator<<((ostream *)&ifs,"The argument for the -e option must be a ");
        std::operator<<(poVar9,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      goto LAB_0010368e;
    case 0x66:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar4 = sptk::ConvertStringToDouble((string *)&ifs,&pad_value);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -f option must be numeric");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      goto LAB_0010368e;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
switchD_001036b4_caseD_67:
      anon_unknown.dwarf_cffe::PrintUsage((ostream *)&std::cerr);
      goto LAB_00104078;
    case 0x68:
      uVar12 = 0;
      anon_unknown.dwarf_cffe::PrintUsage((ostream *)&std::cout);
      goto LAB_0010407b;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar17 = sptk::ConvertStringToInteger((string *)&ifs,&input_block_length);
      bVar4 = input_block_length < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar17 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      goto LAB_0010368e;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&input_block_length);
      bVar17 = input_block_length < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar4 || bVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar9 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar9,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      input_block_length = input_block_length + 1;
      goto LAB_0010368e;
    case 0x73:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&input_start_number);
      bVar17 = input_start_number < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar4 || bVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar9 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a ");
        std::operator<<(poVar9,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      goto LAB_0010368e;
    }
    if (iVar6 == 0x4c) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar17 = sptk::ConvertStringToInteger((string *)&ifs,&output_block_length);
      bVar4 = output_block_length < 1;
      uVar8 = std::__cxx11::string::~string((string *)&ifs);
      local_430 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      if (!bVar17 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -L option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      goto LAB_0010368e;
    }
    if (iVar6 == 0x4d) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&output_block_length);
      bVar17 = output_block_length < 0;
      uVar8 = std::__cxx11::string::~string((string *)&ifs);
      if (!bVar4 || bVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar9 = std::operator<<((ostream *)&ifs,"The argument for the -M option must be a ");
        std::operator<<(poVar9,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      output_block_length = output_block_length + 1;
      local_430 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      goto LAB_0010368e;
    }
    if (iVar6 != 0x53) {
      if (iVar6 != -1) goto switchD_001036b4_caseD_67;
      if (((ulong)local_418 & 1) == 0) {
        input_end_number = input_block_length + -1;
      }
      else {
        if (input_block_length <= input_end_number) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar9 = std::operator<<((ostream *)&ifs,"End number ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,input_end_number);
          poVar9 = std::operator<<(poVar9," must be less than block length ");
          std::ostream::operator<<(poVar9,input_block_length);
          std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
          sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
          goto LAB_0010405e;
        }
        if (input_end_number < input_start_number) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar9 = std::operator<<((ostream *)&ifs,"End number ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,input_end_number);
          poVar9 = std::operator<<(poVar9," must be equal to or greater than start number ");
          std::ostream::operator<<(poVar9,input_start_number);
          std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
          sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
          goto LAB_0010405e;
        }
      }
      if (input_block_length <= input_start_number) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar9 = std::operator<<((ostream *)&ifs,"Start number ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,input_start_number);
        poVar9 = std::operator<<(poVar9," must be less than block length ");
        std::ostream::operator<<(poVar9,input_block_length);
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      iVar6 = (input_end_number - input_start_number) + 1;
      if ((local_430 & 1) == 0) {
        output_block_length = iVar6 + output_start_number;
      }
      else if (output_block_length < iVar6 + output_start_number) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Output block length is too short");
        std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
        sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
        goto LAB_0010405e;
      }
      lVar14 = (long)(argc - ya_optind);
      ppcVar13 = argv + (argc - lVar14);
      pcVar16 = (char *)0x0;
      goto LAB_00103e9a;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_14);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&output_start_number);
    bVar17 = -1 < output_start_number;
    std::__cxx11::string::~string((string *)&ifs);
  } while (bVar4 && bVar17);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar9 = std::operator<<((ostream *)&ifs,"The argument for the -S option must be a ");
  std::operator<<(poVar9,"non-negative integer");
  std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
  sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
LAB_0010405e:
  std::__cxx11::string::~string((string *)&error_message_14);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
LAB_00104078:
  uVar12 = 1;
LAB_0010407b:
  std::__cxx11::string::~string((string *)&data_type);
  return uVar12;
LAB_00103e9a:
  if (lVar14 < 1) goto LAB_00103ef8;
  pcVar15 = *ppcVar13;
  if (*pcVar15 == '+') {
    std::__cxx11::string::string((string *)&ifs,pcVar15,(allocator *)&error_message_14);
    std::__cxx11::string::substr((ulong)&error_message_14,(ulong)&ifs);
    std::__cxx11::string::operator=((string *)&data_type,(string *)&error_message_14);
    std::__cxx11::string::~string((string *)&error_message_14);
    std::__cxx11::string::~string((string *)&ifs);
    pcVar15 = pcVar16;
  }
  else if (pcVar16 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
    sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
    goto LAB_0010405e;
  }
  lVar14 = lVar14 + -1;
  ppcVar13 = ppcVar13 + 1;
  pcVar16 = pcVar15;
  goto LAB_00103e9a;
LAB_00103ef8:
  bVar4 = sptk::SetBinaryMode();
  if (bVar4) {
    this = &ifs;
    std::ifstream::ifstream(this);
    if ((pcVar16 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar16),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
      cVar5 = std::__basic_file<char>::is_open();
      iVar3 = output_start_number;
      iVar2 = input_start_number;
      iVar1 = input_end_number;
      iVar6 = input_block_length;
      if (cVar5 == '\0') {
        this = (ifstream *)&std::cin;
      }
      local_430 = CONCAT44(local_430._4_4_,output_block_length);
      local_418 = pad_value;
      uStack_410 = 0;
      bVar4 = std::operator==("c",&data_type);
      if (bVar4) {
        plVar10 = (long *)operator_new(0x20);
        ppuVar11 = &PTR__BlockCopyInterface_001179a8;
LAB_00104100:
        *plVar10 = (long)ppuVar11;
        *(int *)(plVar10 + 1) = iVar2;
        *(int *)((long)plVar10 + 0xc) = iVar1;
        *(int *)(plVar10 + 2) = iVar6;
        *(int *)((long)plVar10 + 0x14) = iVar3;
        *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
        *(char *)((long)plVar10 + 0x1c) = (char)(int)local_418;
        *(undefined1 *)((long)plVar10 + 0x1d) = 0;
      }
      else {
        bVar4 = std::operator==("s",&data_type);
        if (bVar4) {
          plVar10 = (long *)operator_new(0x20);
          ppuVar11 = &PTR__BlockCopyInterface_001179f8;
LAB_00104154:
          *plVar10 = (long)ppuVar11;
          *(int *)(plVar10 + 1) = iVar2;
          *(int *)((long)plVar10 + 0xc) = iVar1;
          *(int *)(plVar10 + 2) = iVar6;
          *(int *)((long)plVar10 + 0x14) = iVar3;
          *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
          *(short *)((long)plVar10 + 0x1c) = (short)(int)local_418;
          *(undefined1 *)((long)plVar10 + 0x1e) = 0;
        }
        else {
          bVar4 = std::operator==("h",&data_type);
          if (bVar4) {
            plVar10 = (long *)operator_new(0x20);
            error_message_14 = SUB41((int)local_418,0);
            iVar7 = sptk::int24_t::operator_cast_to_int((int24_t *)&error_message_14);
            ppuVar11 = &PTR__BlockCopy_00117a38;
LAB_001041cb:
            *plVar10 = (long)ppuVar11;
            *(int *)(plVar10 + 1) = iVar2;
            *(int *)((long)plVar10 + 0xc) = iVar1;
            *(int *)(plVar10 + 2) = iVar6;
            *(int *)((long)plVar10 + 0x14) = iVar3;
            *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
            *(char *)((long)plVar10 + 0x1c) = (char)iVar7;
            *(char *)((long)plVar10 + 0x1d) = (char)((uint)iVar7 >> 8);
            *(char *)((long)plVar10 + 0x1e) = (char)((uint)iVar7 >> 0x10);
            *(undefined1 *)((long)plVar10 + 0x1f) = 0;
          }
          else {
            bVar4 = std::operator==("i",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x28);
              ppuVar11 = &PTR__BlockCopyInterface_00117a78;
              *plVar10 = (long)&PTR__BlockCopyInterface_00117a78;
              *(int *)(plVar10 + 1) = iVar2;
              *(int *)((long)plVar10 + 0xc) = iVar1;
              *(int *)(plVar10 + 2) = iVar6;
              *(int *)((long)plVar10 + 0x14) = iVar3;
              *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
              *(int *)((long)plVar10 + 0x1c) = (int)local_418;
              goto LAB_00104245;
            }
            bVar4 = std::operator==("l",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x30);
              ppuVar11 = &PTR__BlockCopyInterface_00117ab8;
              *plVar10 = (long)&PTR__BlockCopyInterface_00117ab8;
              *(int *)(plVar10 + 1) = iVar2;
              *(int *)((long)plVar10 + 0xc) = iVar1;
              *(int *)(plVar10 + 2) = iVar6;
              *(int *)((long)plVar10 + 0x14) = iVar3;
              *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
              plVar10[4] = (long)local_418;
              goto LAB_0010429b;
            }
            bVar4 = std::operator==("C",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x20);
              ppuVar11 = &PTR__BlockCopyInterface_00117af8;
              goto LAB_00104100;
            }
            bVar4 = std::operator==("S",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x20);
              ppuVar11 = &PTR__BlockCopyInterface_00117b38;
              goto LAB_00104154;
            }
            bVar4 = std::operator==("H",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x20);
              iVar7 = (int)local_418;
              ppuVar11 = &PTR__BlockCopy_00117b78;
              goto LAB_001041cb;
            }
            bVar4 = std::operator==("I",&data_type);
            if (bVar4) {
              plVar10 = (long *)operator_new(0x28);
              ppuVar11 = &PTR__BlockCopyInterface_00117bb8;
              *plVar10 = (long)&PTR__BlockCopyInterface_00117bb8;
              *(int *)(plVar10 + 1) = iVar2;
              *(int *)((long)plVar10 + 0xc) = iVar1;
              *(int *)(plVar10 + 2) = iVar6;
              *(int *)((long)plVar10 + 0x14) = iVar3;
              *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
              *(int *)((long)plVar10 + 0x1c) = (int)(long)local_418;
LAB_00104245:
              *(undefined1 *)(plVar10 + 4) = 0;
            }
            else {
              bVar4 = std::operator==("L",&data_type);
              if (bVar4) {
                plVar10 = (long *)operator_new(0x30);
                ppuVar11 = &PTR__BlockCopyInterface_00117bf8;
                *plVar10 = (long)&PTR__BlockCopyInterface_00117bf8;
                *(int *)(plVar10 + 1) = iVar2;
                *(int *)((long)plVar10 + 0xc) = iVar1;
                *(int *)(plVar10 + 2) = iVar6;
                *(int *)((long)plVar10 + 0x14) = iVar3;
                *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
                plVar10[4] = (long)(local_418 - 9.223372036854776e+18) & (long)local_418 >> 0x3f |
                             (long)local_418;
              }
              else {
                bVar4 = std::operator==("f",&data_type);
                if (bVar4) {
                  plVar10 = (long *)operator_new(0x28);
                  ppuVar11 = &PTR__BlockCopyInterface_00117c38;
                  *plVar10 = (long)&PTR__BlockCopyInterface_00117c38;
                  *(int *)(plVar10 + 1) = iVar2;
                  *(int *)((long)plVar10 + 0xc) = iVar1;
                  *(int *)(plVar10 + 2) = iVar6;
                  *(int *)((long)plVar10 + 0x14) = iVar3;
                  *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
                  *(float *)((long)plVar10 + 0x1c) = (float)local_418;
                  goto LAB_00104245;
                }
                bVar4 = std::operator==("d",&data_type);
                if (!bVar4) {
                  bVar4 = std::operator==("e",&data_type);
                  if (bVar4) {
                    plVar10 = (long *)operator_new(0x40);
                    ppuVar11 = &PTR__BlockCopyInterface_00117cb8;
                    *plVar10 = (long)&PTR__BlockCopyInterface_00117cb8;
                    *(int *)(plVar10 + 1) = iVar2;
                    *(int *)((long)plVar10 + 0xc) = iVar1;
                    *(int *)(plVar10 + 2) = iVar6;
                    *(int *)((long)plVar10 + 0x14) = iVar3;
                    *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
                    local_3c0 = local_418;
                    *(longdouble *)(plVar10 + 4) = (longdouble)local_418;
                    *(undefined1 *)(plVar10 + 6) = 0;
                  }
                  else {
                    bVar4 = std::operator==("a",&data_type);
                    if (!bVar4) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_14)
                      ;
                      std::operator<<((ostream *)&error_message_14,
                                      "Unexpected argument for the +type option");
                      std::__cxx11::string::string((string *)&local_408,"bcp",&local_435);
                      sptk::PrintErrorMessage(&local_408,&error_message_14);
                      goto LAB_00103f9f;
                    }
                    plVar10 = (long *)operator_new(0x40);
                    ppuVar11 = &PTR__BlockCopyInterface_00117cb8;
                    *plVar10 = (long)&PTR__BlockCopyInterface_00117cb8;
                    *(int *)(plVar10 + 1) = iVar2;
                    *(int *)((long)plVar10 + 0xc) = iVar1;
                    *(int *)(plVar10 + 2) = iVar6;
                    *(int *)((long)plVar10 + 0x14) = iVar3;
                    *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
                    local_3b8 = local_418;
                    *(longdouble *)(plVar10 + 4) = (longdouble)local_418;
                    *(undefined1 *)(plVar10 + 6) = 1;
                  }
                  goto LAB_0010429f;
                }
                plVar10 = (long *)operator_new(0x30);
                ppuVar11 = &PTR__BlockCopyInterface_00117c78;
                *plVar10 = (long)&PTR__BlockCopyInterface_00117c78;
                *(int *)(plVar10 + 1) = iVar2;
                *(int *)((long)plVar10 + 0xc) = iVar1;
                *(int *)(plVar10 + 2) = iVar6;
                *(int *)((long)plVar10 + 0x14) = iVar3;
                *(undefined4 *)(plVar10 + 3) = (undefined4)local_430;
                plVar10[4] = (long)local_418;
              }
LAB_0010429b:
              *(undefined1 *)(plVar10 + 5) = 0;
            }
          }
        }
      }
LAB_0010429f:
      cVar5 = (*(code *)ppuVar11[2])(plVar10,this);
      if (cVar5 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_14);
        std::operator<<((ostream *)&error_message_14,"Failed to copy");
        std::__cxx11::string::string((string *)&local_408,"bcp",&local_435);
        sptk::PrintErrorMessage(&local_408,&error_message_14);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_14);
      }
      uVar12 = (uint)(cVar5 == '\0');
      (**(code **)(*plVar10 + 8))(plVar10);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_14);
      poVar9 = std::operator<<((ostream *)&error_message_14,"Cannot open file ");
      std::operator<<(poVar9,pcVar16);
      std::__cxx11::string::string((string *)&local_408,"bcp",&local_435);
      sptk::PrintErrorMessage(&local_408,&error_message_14);
LAB_00103f9f:
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_14);
      uVar12 = 1;
    }
    std::ifstream::~ifstream(&ifs);
    goto LAB_0010407b;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"Cannot set translation mode");
  std::__cxx11::string::string((string *)&error_message_14,"bcp",(allocator *)&local_408);
  sptk::PrintErrorMessage((string *)&error_message_14,(ostringstream *)&ifs);
  goto LAB_0010405e;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_start_number(kDefaultInputStartNumber);
  int input_end_number(kDefaultInputBlockLength - 1);
  int input_block_length(kDefaultInputBlockLength);
  int output_start_number(kDefaultOutputStartNumber);
  int output_block_length(kDefaultInputBlockLength);
  double pad_value(kDefaultPadValue);
  std::string data_type(kDefaultDataType);
  bool is_input_end_number_specified(false);
  bool is_output_block_length_specified(false);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "s:e:l:m:S:L:M:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &input_start_number) ||
            input_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &input_end_number) ||
            input_end_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_input_end_number_specified = true;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++input_block_length;
        break;
      }
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &output_start_number) ||
            output_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_output_block_length_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++output_block_length;
        is_output_block_length_specified = true;
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &pad_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be numeric";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_input_end_number_specified) {
    input_end_number = input_block_length - 1;
  } else if (input_block_length <= input_end_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  } else if (input_end_number < input_start_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be equal to or greater than start number "
                  << input_start_number;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (input_block_length <= input_start_number) {
    std::ostringstream error_message;
    error_message << "Start number " << input_start_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const int copy_length(input_end_number - input_start_number + 1);
  if (!is_output_block_length_specified) {
    output_block_length = output_start_number + copy_length;
  } else if (output_block_length < output_start_number + copy_length) {
    std::ostringstream error_message;
    error_message << "Output block length is too short";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  BlockCopyWrapper block_copy(data_type, input_start_number, input_end_number,
                              input_block_length, output_start_number,
                              output_block_length, pad_value);

  if (!block_copy.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (!block_copy.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to copy";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  return 0;
}